

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O0

int aom_noise_data_validate(double *data,int w,int h)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar5;
  double d;
  double *var_y;
  double *var_x;
  double *mean_y;
  double *mean_x;
  double mean;
  double var;
  int ret_value;
  int y;
  int x;
  double kMeanThreshold;
  double kVarianceThreshold;
  void *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  double local_48;
  double local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_34 = 1;
  local_40 = 0.0;
  local_48 = 0.0;
  pvVar1 = aom_calloc(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
  pvVar2 = aom_calloc(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
  pvVar3 = aom_calloc(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
  pvVar4 = aom_calloc(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
  if ((((pvVar1 == (void *)0x0) || (pvVar2 == (void *)0x0)) || (pvVar3 == (void *)0x0)) ||
     (pvVar4 == (void *)0x0)) {
    aom_free(in_stack_ffffffffffffff90);
    aom_free(in_stack_ffffffffffffff90);
    aom_free(in_stack_ffffffffffffff90);
    aom_free(in_stack_ffffffffffffff90);
    local_4 = 0;
  }
  else {
    for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
      for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
        in_stack_ffffffffffffff90 = *(void **)(in_RDI + (long)(local_30 * in_ESI + local_2c) * 8);
        *(double *)((long)pvVar2 + (long)local_2c * 8) =
             (double)in_stack_ffffffffffffff90 * (double)in_stack_ffffffffffffff90 +
             *(double *)((long)pvVar2 + (long)local_2c * 8);
        *(double *)((long)pvVar4 + (long)local_30 * 8) =
             (double)in_stack_ffffffffffffff90 * (double)in_stack_ffffffffffffff90 +
             *(double *)((long)pvVar4 + (long)local_30 * 8);
        *(double *)((long)pvVar1 + (long)local_2c * 8) =
             (double)in_stack_ffffffffffffff90 + *(double *)((long)pvVar1 + (long)local_2c * 8);
        *(double *)((long)pvVar3 + (long)local_30 * 8) =
             (double)in_stack_ffffffffffffff90 + *(double *)((long)pvVar3 + (long)local_30 * 8);
        local_40 = (double)in_stack_ffffffffffffff90 * (double)in_stack_ffffffffffffff90 + local_40;
        local_48 = (double)in_stack_ffffffffffffff90 + local_48;
      }
    }
    local_48 = local_48 / (double)(in_ESI * in_EDX);
    dVar5 = -local_48 * local_48 + local_40 / (double)(in_ESI * in_EDX);
    for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
      *(double *)((long)pvVar3 + (long)local_30 * 8) =
           *(double *)((long)pvVar3 + (long)local_30 * 8) / (double)in_EDX;
      *(double *)((long)pvVar4 + (long)local_30 * 8) =
           -*(double *)((long)pvVar3 + (long)local_30 * 8) *
           *(double *)((long)pvVar3 + (long)local_30 * 8) +
           *(double *)((long)pvVar4 + (long)local_30 * 8) / (double)in_EDX;
      if (2.0 <= ABS(*(double *)((long)pvVar4 + (long)local_30 * 8) - dVar5)) {
        fprintf(_stderr,"Variance distance too large %f %f\n",
                *(undefined8 *)((long)pvVar4 + (long)local_30 * 8),SUB84(dVar5,0));
        local_34 = 0;
        break;
      }
      if (2.0 <= ABS(*(double *)((long)pvVar3 + (long)local_30 * 8) - local_48)) {
        fprintf(_stderr,"Mean distance too large %f %f\n",
                *(undefined8 *)((long)pvVar3 + (long)local_30 * 8),SUB84(local_48,0));
        local_34 = 0;
        break;
      }
    }
    for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
      *(double *)((long)pvVar1 + (long)local_2c * 8) =
           *(double *)((long)pvVar1 + (long)local_2c * 8) / (double)in_ESI;
      *(double *)((long)pvVar2 + (long)local_2c * 8) =
           -*(double *)((long)pvVar1 + (long)local_2c * 8) *
           *(double *)((long)pvVar1 + (long)local_2c * 8) +
           *(double *)((long)pvVar2 + (long)local_2c * 8) / (double)in_ESI;
      if (2.0 <= ABS(*(double *)((long)pvVar2 + (long)local_2c * 8) - dVar5)) {
        fprintf(_stderr,"Variance distance too large %f %f\n",
                *(undefined8 *)((long)pvVar2 + (long)local_2c * 8),SUB84(dVar5,0));
        local_34 = 0;
        break;
      }
      if (2.0 <= ABS(*(double *)((long)pvVar1 + (long)local_2c * 8) - local_48)) {
        fprintf(_stderr,"Mean distance too large %f %f\n",
                *(undefined8 *)((long)pvVar1 + (long)local_2c * 8),SUB84(local_48,0));
        local_34 = 0;
        break;
      }
    }
    aom_free(in_stack_ffffffffffffff90);
    aom_free(in_stack_ffffffffffffff90);
    aom_free(in_stack_ffffffffffffff90);
    aom_free(in_stack_ffffffffffffff90);
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

int aom_noise_data_validate(const double *data, int w, int h) {
  const double kVarianceThreshold = 2;
  const double kMeanThreshold = 2;

  int x = 0, y = 0;
  int ret_value = 1;
  double var = 0, mean = 0;
  double *mean_x, *mean_y, *var_x, *var_y;

  // Check that noise variance is not increasing in x or y
  // and that the data is zero mean.
  mean_x = (double *)aom_calloc(w, sizeof(*mean_x));
  var_x = (double *)aom_calloc(w, sizeof(*var_x));
  mean_y = (double *)aom_calloc(h, sizeof(*mean_x));
  var_y = (double *)aom_calloc(h, sizeof(*var_y));
  if (!(mean_x && var_x && mean_y && var_y)) {
    aom_free(mean_x);
    aom_free(mean_y);
    aom_free(var_x);
    aom_free(var_y);
    return 0;
  }

  for (y = 0; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      const double d = data[y * w + x];
      var_x[x] += d * d;
      var_y[y] += d * d;
      mean_x[x] += d;
      mean_y[y] += d;
      var += d * d;
      mean += d;
    }
  }
  mean /= (w * h);
  var = var / (w * h) - mean * mean;

  for (y = 0; y < h; ++y) {
    mean_y[y] /= h;
    var_y[y] = var_y[y] / h - mean_y[y] * mean_y[y];
    if (fabs(var_y[y] - var) >= kVarianceThreshold) {
      fprintf(stderr, "Variance distance too large %f %f\n", var_y[y], var);
      ret_value = 0;
      break;
    }
    if (fabs(mean_y[y] - mean) >= kMeanThreshold) {
      fprintf(stderr, "Mean distance too large %f %f\n", mean_y[y], mean);
      ret_value = 0;
      break;
    }
  }

  for (x = 0; x < w; ++x) {
    mean_x[x] /= w;
    var_x[x] = var_x[x] / w - mean_x[x] * mean_x[x];
    if (fabs(var_x[x] - var) >= kVarianceThreshold) {
      fprintf(stderr, "Variance distance too large %f %f\n", var_x[x], var);
      ret_value = 0;
      break;
    }
    if (fabs(mean_x[x] - mean) >= kMeanThreshold) {
      fprintf(stderr, "Mean distance too large %f %f\n", mean_x[x], mean);
      ret_value = 0;
      break;
    }
  }

  aom_free(mean_x);
  aom_free(mean_y);
  aom_free(var_x);
  aom_free(var_y);

  return ret_value;
}